

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O3

int cd_ascii_white_space_init(parser_info *info,char **attr)

{
  node_info *pnVar1;
  int iVar2;
  coda_type_text *type;
  int iVar3;
  
  iVar2 = handle_format_attribute_for_type(info,attr);
  iVar3 = -1;
  if (iVar2 == 0) {
    pnVar1 = info->node;
    pnVar1->free_data = coda_type_release;
    type = coda_type_text_new(pnVar1->format);
    info->node->data = type;
    if (type != (coda_type_text *)0x0) {
      iVar2 = coda_type_text_set_special_text_type(type,ascii_text_whitespace);
      if (iVar2 == 0) {
        iVar2 = handle_name_attribute_for_type(info,attr);
        if (iVar2 == 0) {
          pnVar1 = info->node;
          pnVar1->init_sub_element[0xb] = string_data_init;
          pnVar1->add_element_to_parent[0xb] = type_set_description;
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int cd_ascii_white_space_init(parser_info *info, const char **attr)
{
    if (handle_format_attribute_for_type(info, attr) != 0)
    {
        return -1;
    }

    info->node->free_data = (free_data_handler)coda_type_release;
    info->node->data = coda_type_text_new(info->node->format);
    if (info->node->data == NULL)
    {
        return -1;
    }
    if (coda_type_text_set_special_text_type((coda_type_text *)info->node->data, ascii_text_whitespace) != 0)
    {
        return -1;
    }
    if (handle_name_attribute_for_type(info, attr) != 0)
    {
        return -1;
    }

    register_sub_element(info->node, element_cd_description, string_data_init, type_set_description);

    return 0;
}